

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O1

bool __thiscall ftxui::anon_unknown_3::ToggleBase::OnEvent(ToggleBase *this,Event *event)

{
  undefined8 uVar1;
  pointer pcVar2;
  Ref<int> *pRVar3;
  ComponentBase *__n;
  size_t __n_00;
  Button BVar4;
  Motion MVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar11;
  Ref<int> *pRVar12;
  ToggleOption *pTVar13;
  int iVar14;
  ToggleOption *pTVar15;
  ulong uVar16;
  pointer pBVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  int local_e8;
  int iStack_e4;
  long *local_e0 [2];
  long local_d0 [2];
  ScreenInteractive *local_c0;
  Event local_b0;
  Event local_70;
  
  if (event->type_ == Mouse) {
    uVar1 = *(undefined8 *)((long)&event->field_1 + 0xc);
    BVar4 = (event->field_1).mouse_.button;
    MVar5 = (event->field_1).mouse_.motion;
    pcVar2 = (event->input_)._M_dataplus._M_p;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,pcVar2,pcVar2 + (event->input_)._M_string_length);
    local_c0 = event->screen_;
    ComponentBase::CaptureMouse((ComponentBase *)&local_b0,(Event *)this);
    if ((_func_int **)local_b0._0_8_ == (_func_int **)0x0) {
      bVar20 = false;
    }
    else {
      (**(code **)(*(_func_int **)local_b0._0_8_ + 8))();
      pBVar17 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar7 = (int)((ulong)((long)(this->boxes_).
                                  super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar17) >> 4);
      bVar20 = 0 < iVar7;
      if (0 < iVar7) {
        bVar20 = true;
        lVar19 = 0;
        lVar18 = 0;
        do {
          local_e8 = (int)uVar1;
          iStack_e4 = (int)((ulong)uVar1 >> 0x20);
          bVar6 = Box::Contain((Box *)((long)&pBVar17->x_min + lVar19),local_e8,iStack_e4);
          if (bVar6) {
            ComponentBase::TakeFocus(&this->super_ComponentBase);
            pTVar13 = (this->option_).address_;
            if (pTVar13 == (ToggleOption *)0x0) {
              pTVar13 = &(this->option_).owned_;
            }
            pRVar3 = (Ref<int> *)(pTVar13->focused_entry).address_;
            pRVar12 = &pTVar13->focused_entry;
            if (pRVar3 != (Ref<int> *)0x0) {
              pRVar12 = pRVar3;
            }
            iVar7 = (int)lVar18;
            pRVar12->owned_ = iVar7;
            if ((BVar4 == Left) && (MVar5 == Pressed)) {
              ComponentBase::TakeFocus(&this->super_ComponentBase);
              if (*this->selected_ != iVar7) {
                *this->selected_ = iVar7;
                pTVar13 = (this->option_).address_;
                pTVar15 = &(this->option_).owned_;
                if (pTVar13 != (ToggleOption *)0x0) {
                  pTVar15 = pTVar13;
                }
                if ((pTVar15->on_change).super__Function_base._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(pTVar15->on_change)._M_invoker)((_Any_data *)&pTVar15->on_change);
              }
              break;
            }
          }
          lVar18 = lVar18 + 1;
          pBVar17 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar9 = (long)(int)((ulong)((long)(this->boxes_).
                                            super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar17) >> 4);
          lVar19 = lVar19 + 0x10;
          bVar20 = lVar18 < lVar9;
        } while (lVar18 < lVar9);
      }
    }
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
  }
  else {
    iVar7 = *this->selected_;
    bVar6 = Event::operator==(event,(Event *)Event::ArrowLeft);
    bVar20 = true;
    if (!bVar6) {
      Event::Character(&local_b0,'h');
      __n = (ComponentBase *)(event->input_)._M_string_length;
      if (__n == (ComponentBase *)local_b0.input_._M_string_length) {
        if (__n != (ComponentBase *)0x0) {
          iVar8 = bcmp((event->input_)._M_dataplus._M_p,local_b0.input_._M_dataplus._M_p,(size_t)__n
                      );
          bVar20 = iVar8 == 0;
        }
      }
      else {
        bVar20 = false;
      }
    }
    if ((!bVar6) && (local_b0.input_._M_dataplus._M_p != (pointer)((long)&local_b0 + 0x28U))) {
      operator_delete(local_b0.input_._M_dataplus._M_p,
                      local_b0.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar20) {
      *this->selected_ = *this->selected_ + -1;
    }
    bVar6 = Event::operator==(event,(Event *)Event::ArrowRight);
    bVar20 = true;
    if (!bVar6) {
      Event::Character(&local_70,'l');
      __n_00 = (event->input_)._M_string_length;
      if (__n_00 == local_70.input_._M_string_length) {
        if (__n_00 != 0) {
          iVar8 = bcmp((event->input_)._M_dataplus._M_p,local_70.input_._M_dataplus._M_p,__n_00);
          bVar20 = iVar8 == 0;
        }
      }
      else {
        bVar20 = false;
      }
    }
    if ((!bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.input_._M_dataplus._M_p != &local_70.input_.field_2)) {
      operator_delete(local_70.input_._M_dataplus._M_p,
                      local_70.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar20) {
      *this->selected_ = *this->selected_ + 1;
    }
    bVar20 = Event::operator==(event,(Event *)Event::Tab);
    if (bVar20) {
      pvVar11 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)(this->entries_).ref_;
      pvVar10 = pvVar11;
      if (pvVar11 ==
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)0x0) {
        pvVar10 = (this->entries_).ref_wide_;
      }
      if (*(pointer *)(pvVar10 + 8) != *(pointer *)pvVar10) {
        if (pvVar11 ==
            (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          pvVar11 = (this->entries_).ref_wide_;
        }
        *this->selected_ =
             (int)(((long)*this->selected_ + 1U) %
                  (ulong)((long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 >> 5));
      }
    }
    bVar20 = Event::operator==(event,(Event *)Event::TabReverse);
    if (bVar20) {
      pvVar11 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)(this->entries_).ref_;
      pvVar10 = pvVar11;
      if (pvVar11 ==
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)0x0) {
        pvVar10 = (this->entries_).ref_wide_;
      }
      if (*(pointer *)(pvVar10 + 8) != *(pointer *)pvVar10) {
        if (pvVar11 ==
            (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          pvVar11 = (this->entries_).ref_wide_;
        }
        uVar16 = (long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 >> 5;
        *this->selected_ = (int)((((long)*this->selected_ + uVar16) - 1) % uVar16);
      }
    }
    pvVar11 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)(this->entries_).ref_;
    if (pvVar11 ==
        (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      pvVar11 = (this->entries_).ref_wide_;
    }
    iVar14 = (int)((ulong)((long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11) >> 5) + -1;
    iVar8 = *this->selected_;
    if (iVar8 < iVar14) {
      iVar14 = iVar8;
    }
    iVar8 = 0;
    if (0 < iVar14) {
      iVar8 = iVar14;
    }
    *this->selected_ = iVar8;
    if (iVar7 == iVar8) {
      bVar20 = Event::operator==(event,(Event *)Event::Return);
      if (!bVar20) {
        return false;
      }
      pTVar13 = (this->option_).address_;
      pTVar15 = &(this->option_).owned_;
      if (pTVar13 != (ToggleOption *)0x0) {
        pTVar15 = pTVar13;
      }
      if ((pTVar15->on_enter).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0014da45:
        std::__throw_bad_function_call();
      }
      (*(pTVar15->on_enter)._M_invoker)((_Any_data *)&pTVar15->on_enter);
    }
    else {
      pTVar13 = (this->option_).address_;
      if (pTVar13 == (ToggleOption *)0x0) {
        pTVar13 = &(this->option_).owned_;
      }
      pRVar3 = (Ref<int> *)(pTVar13->focused_entry).address_;
      pRVar12 = &pTVar13->focused_entry;
      if (pRVar3 != (Ref<int> *)0x0) {
        pRVar12 = pRVar3;
      }
      pRVar12->owned_ = iVar8;
      pTVar13 = (this->option_).address_;
      if (pTVar13 == (ToggleOption *)0x0) {
        pTVar13 = &(this->option_).owned_;
      }
      if ((pTVar13->on_change).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0014da45;
      (*(pTVar13->on_change)._M_invoker)((_Any_data *)&pTVar13->on_change);
    }
    bVar20 = true;
  }
  return bVar20;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    int old_selected = *selected_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      (*selected_)--;
    if (event == Event::ArrowRight || event == Event::Character('l'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (old_selected != *selected_) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }